

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O2

Position * __thiscall
iDynTree::Position::operator+(Position *__return_storage_ptr__,Position *this,Position *other)

{
  compose(__return_storage_ptr__,this,other);
  return __return_storage_ptr__;
}

Assistant:

Position Position::operator+(const Position& other) const
    {
        return compose(*this,other);
    }